

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlCatalogPtr xmlCreateNewCatalog(xmlCatalogType type,xmlCatalogPrefer prefer)

{
  xmlCatalogPtr pxVar1;
  xmlHashTablePtr pxVar2;
  
  pxVar1 = (xmlCatalogPtr)(*xmlMalloc)(0x78);
  if (pxVar1 == (xmlCatalogPtr)0x0) {
    xmlCatalogErrMemory("allocating catalog");
    pxVar1 = (xmlCatalogPtr)0x0;
  }
  else {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->catalTab[0] = (char *)0x0;
    pxVar1->catalTab[9] = (char *)0x0;
    pxVar1->catalNr = 0;
    pxVar1->catalMax = 0;
    pxVar1->sgml = (xmlHashTablePtr)0x0;
    *(undefined8 *)&pxVar1->prefer = 0;
    pxVar1->catalTab[7] = (char *)0x0;
    pxVar1->catalTab[8] = (char *)0x0;
    pxVar1->catalTab[5] = (char *)0x0;
    pxVar1->catalTab[6] = (char *)0x0;
    pxVar1->catalTab[3] = (char *)0x0;
    pxVar1->catalTab[4] = (char *)0x0;
    pxVar1->catalTab[1] = (char *)0x0;
    pxVar1->catalTab[2] = (char *)0x0;
    pxVar1->xml = (xmlCatalogEntryPtr)0x0;
    pxVar1->type = type;
    pxVar1->catalNr = 0;
    pxVar1->catalMax = 10;
    pxVar1->prefer = prefer;
    if (type == XML_SGML_CATALOG_TYPE) {
      pxVar2 = xmlHashCreate(10);
      pxVar1->sgml = pxVar2;
    }
  }
  return pxVar1;
}

Assistant:

static xmlCatalogPtr
xmlCreateNewCatalog(xmlCatalogType type, xmlCatalogPrefer prefer) {
    xmlCatalogPtr ret;

    ret = (xmlCatalogPtr) xmlMalloc(sizeof(xmlCatalog));
    if (ret == NULL) {
        xmlCatalogErrMemory("allocating catalog");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlCatalog));
    ret->type = type;
    ret->catalNr = 0;
    ret->catalMax = XML_MAX_SGML_CATA_DEPTH;
    ret->prefer = prefer;
    if (ret->type == XML_SGML_CATALOG_TYPE)
	ret->sgml = xmlHashCreate(10);
    return(ret);
}